

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

uint __thiscall capnp::compiler::NodeTranslator::StructLayout::Group::addPointer(Group *this)

{
  uint uVar1;
  Union *this_00;
  uint *puVar2;
  RemoveConst<unsigned_int> *pRVar3;
  uint uVar4;
  
  addMember(this);
  uVar1 = this->parentPointerLocationUsage;
  this_00 = this->parent;
  puVar2 = (this_00->pointerLocations).builder.ptr;
  pRVar3 = (this_00->pointerLocations).builder.pos;
  this->parentPointerLocationUsage = uVar1 + 1;
  if ((ulong)uVar1 < (ulong)((long)pRVar3 - (long)puVar2 >> 2)) {
    return puVar2[uVar1];
  }
  uVar4 = Union::addNewPointerLocation(this_00);
  return uVar4;
}

Assistant:

uint addPointer() override {
      addMember();

      if (parentPointerLocationUsage < parent.pointerLocations.size()) {
        return parent.pointerLocations[parentPointerLocationUsage++];
      } else {
        parentPointerLocationUsage++;
        return parent.addNewPointerLocation();
      }
    }